

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# LinearModelValidator.cpp
# Opt level: O3

Result * CoreML::validate<(MLModelType)400>(Result *__return_storage_ptr__,Model *format)

{
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  *paVar1;
  int iVar2;
  bool bVar3;
  Type *pTVar4;
  LogMessage *other;
  RepeatedPtrField<CoreML::Specification::FeatureDescription> *features;
  long lVar5;
  int iVar6;
  ModelDescription *from;
  undefined1 *puVar7;
  RepeatedPtrField<CoreML::Specification::GLMClassifier_DoubleArray> weights;
  GLMClassifier glmClassifier;
  ModelDescription interface;
  ValidationPolicy *in_stack_fffffffffffffe48;
  undefined1 local_1b0 [63];
  LogFinisher local_171;
  undefined1 local_170 [8];
  _Alloc_hider local_168;
  size_type local_160;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  local_158;
  RepeatedPtrFieldBase local_148;
  undefined1 local_130 [8];
  _Alloc_hider local_128;
  undefined1 local_120 [24];
  int local_108;
  uint local_f8;
  uint local_f4;
  ClassLabelsUnion local_f0;
  uint32_t local_e4 [1];
  undefined1 local_e0 [176];
  
  from = format->description_;
  if (from == (ModelDescription *)0x0) {
    from = (ModelDescription *)&Specification::_ModelDescription_default_instance_;
  }
  Specification::ModelDescription::ModelDescription((ModelDescription *)local_e0,from);
  if (format->_oneof_case_[0] == 400) {
    puVar7 = (undefined1 *)(format->Type_).pipelineclassifier_;
  }
  else {
    puVar7 = Specification::_GLMClassifier_default_instance_;
  }
  local_130._0_4_ = NO_ERROR;
  validateClassifierInterface<CoreML::Specification::Model,CoreML::Specification::GLMClassifier>
            ((Result *)local_170,(CoreML *)format,(Model *)puVar7,(GLMClassifier *)0x0,false,
             SUB81(local_130,0),in_stack_fffffffffffffe48);
  bVar3 = Result::good((Result *)local_170);
  if (bVar3) {
    validateDescriptionsAreAllVectorizableTypes<google::protobuf::RepeatedPtrField<CoreML::Specification::FeatureDescription>>
              ((Result *)local_130,(CoreML *)(local_e0 + 0x10),features);
    local_170._4_4_ = local_130._4_4_;
    local_170._0_4_ = local_130._0_4_;
    std::__cxx11::string::operator=((string *)&local_168,(string *)&local_128);
    if (local_128._M_p != local_120 + 8) {
      operator_delete(local_128._M_p,CONCAT44(local_120._12_4_,local_120._8_4_) + 1);
    }
    bVar3 = Result::good((Result *)local_170);
    if (bVar3) {
      if (format->_oneof_case_[0] == 400) {
        puVar7 = (undefined1 *)(format->Type_).glmclassifier_;
      }
      else {
        puVar7 = Specification::_GLMClassifier_default_instance_;
      }
      Specification::GLMClassifier::GLMClassifier
                ((GLMClassifier *)local_130,(GLMClassifier *)puVar7);
      if (local_f8 < 2) {
        if (1 < local_f4) {
          local_1b0._0_8_ = local_1b0 + 0x10;
          std::__cxx11::string::_M_construct<char_const*>
                    ((string *)local_1b0,"Invalid class encoding","");
          Result::Result(__return_storage_ptr__,INVALID_MODEL_PARAMETERS,(string *)local_1b0);
          goto LAB_002f0743;
        }
        if (local_120._8_4_ == 0) {
          local_1b0._0_8_ = local_1b0 + 0x10;
          std::__cxx11::string::_M_construct<char_const*>
                    ((string *)local_1b0,
                     "The number of DoubleArrays in weights must be greater than zero","");
          Result::Result(__return_storage_ptr__,INVALID_MODEL_PARAMETERS,(string *)local_1b0);
          goto LAB_002f0743;
        }
        if (local_120._8_4_ != local_108) {
          local_1b0._0_8_ = local_1b0 + 0x10;
          std::__cxx11::string::_M_construct<char_const*>
                    ((string *)local_1b0,
                     "The number of DoubleArrays in weights must match number of offsets","");
          Result::Result(__return_storage_ptr__,INVALID_MODEL_PARAMETERS,(string *)local_1b0);
          goto LAB_002f0743;
        }
        if (local_e4[0] == 0x65) {
          lVar5 = 0x10;
LAB_002f0790:
          iVar6 = *(int *)((long)&((local_f0.stringclasslabels_)->super_MessageLite).
                                  _vptr_MessageLite + lVar5);
        }
        else {
          iVar6 = -1;
          if (local_e4[0] == 100) {
            lVar5 = 0x18;
            goto LAB_002f0790;
          }
        }
        if (local_f4 == 0) {
          if (local_120._8_4_ == iVar6 + -1 || iVar6 == -1) {
LAB_002f0846:
            if ((local_f8 != 1) || (iVar6 < 3)) goto LAB_002f0888;
            local_1b0._0_8_ = local_1b0 + 0x10;
            std::__cxx11::string::_M_construct<char_const*>
                      ((string *)local_1b0,
                       "Probit post evaluation transform is only supported for binary classification"
                       ,"");
            Result::Result(__return_storage_ptr__,INVALID_MODEL_PARAMETERS,(string *)local_1b0);
          }
          else {
            local_1b0._0_8_ = local_1b0 + 0x10;
            std::__cxx11::string::_M_construct<char_const*>
                      ((string *)local_1b0,
                       "With ReferenceClass encoding the number of DoubleArrays in weights must be one less than number of classes"
                       ,"");
            Result::Result(__return_storage_ptr__,INVALID_MODEL_PARAMETERS,(string *)local_1b0);
          }
          goto LAB_002f0743;
        }
        if (iVar6 != -1) {
          if (iVar6 == 2) {
            if (local_120._8_4_ == 1) goto LAB_002f0888;
            local_1b0._0_8_ = local_1b0 + 0x10;
            std::__cxx11::string::_M_construct<char_const*>
                      ((string *)local_1b0,
                       "When using OneVsRest encoding for only two classes, the number of DoubleArrays in weights must be one"
                       ,"");
            Result::Result(__return_storage_ptr__,INVALID_MODEL_PARAMETERS,(string *)local_1b0);
          }
          else {
            if (local_120._8_4_ == iVar6) goto LAB_002f0846;
            local_1b0._0_8_ = local_1b0 + 0x10;
            std::__cxx11::string::_M_construct<char_const*>
                      ((string *)local_1b0,
                       "With OneVsRest encoding the number of DoubleArrays in weights must equal the number of classes"
                       ,"");
            Result::Result(__return_storage_ptr__,INVALID_MODEL_PARAMETERS,(string *)local_1b0);
          }
          goto LAB_002f0743;
        }
LAB_002f0888:
        google::protobuf::RepeatedPtrField<CoreML::Specification::GLMClassifier_DoubleArray>::
        RepeatedPtrField((RepeatedPtrField<CoreML::Specification::GLMClassifier_DoubleArray> *)
                         &local_148,
                         (RepeatedPtrField<CoreML::Specification::GLMClassifier_DoubleArray> *)
                         local_120);
        pTVar4 = google::protobuf::internal::RepeatedPtrFieldBase::
                 Mutable<google::protobuf::RepeatedPtrField<CoreML::Specification::GLMClassifier_DoubleArray>::TypeHandler>
                           (&local_148,0);
        if ((pTVar4->value_).current_size_ == 0) {
          local_1b0._0_8_ = local_1b0 + 0x10;
          std::__cxx11::string::_M_construct<char_const*>
                    ((string *)local_1b0,"Weight DoubleArrays must have nonzero length","");
          Result::Result(__return_storage_ptr__,INVALID_MODEL_PARAMETERS,(string *)local_1b0);
LAB_002f09eb:
          if ((undefined1 *)local_1b0._0_8_ != local_1b0 + 0x10) {
            operator_delete((void *)local_1b0._0_8_,local_1b0._16_8_ + 1);
          }
        }
        else {
          if (1 < local_148.current_size_) {
            iVar6 = 1;
            do {
              if (local_148.current_size_ < 1) {
                google::protobuf::internal::LogMessage::LogMessage
                          ((LogMessage *)local_1b0,LOGLEVEL_DFATAL,
                           "/workspace/llm4binary/github/license_c_cmakelists/apple[P]coremltools/mlmodel/../deps/protobuf/src/google/protobuf/repeated_ptr_field.h"
                           ,0x36e);
                other = google::protobuf::internal::LogMessage::operator<<
                                  ((LogMessage *)local_1b0,
                                   "CHECK failed: (index) < (current_size_): ");
                google::protobuf::internal::LogFinisher::operator=(&local_171,other);
                google::protobuf::internal::LogMessage::~LogMessage((LogMessage *)local_1b0);
              }
              iVar2 = *(int *)((long)(local_148.rep_)->elements[0] + 0x10);
              pTVar4 = google::protobuf::internal::RepeatedPtrFieldBase::
                       Mutable<google::protobuf::RepeatedPtrField<CoreML::Specification::GLMClassifier_DoubleArray>::TypeHandler>
                                 (&local_148,iVar6);
              if (iVar2 != (pTVar4->value_).current_size_) {
                local_1b0._0_8_ = local_1b0 + 0x10;
                std::__cxx11::string::_M_construct<char_const*>
                          ((string *)local_1b0,"Weight DoubleArrays must have the same length","");
                Result::Result(__return_storage_ptr__,INVALID_MODEL_PARAMETERS,(string *)local_1b0);
                goto LAB_002f09eb;
              }
              iVar6 = iVar6 + 1;
            } while (iVar6 < local_148.current_size_);
          }
          Result::Result(__return_storage_ptr__);
        }
        google::protobuf::RepeatedPtrField<CoreML::Specification::GLMClassifier_DoubleArray>::
        ~RepeatedPtrField((RepeatedPtrField<CoreML::Specification::GLMClassifier_DoubleArray> *)
                          &local_148);
      }
      else {
        local_1b0._0_8_ = local_1b0 + 0x10;
        std::__cxx11::string::_M_construct<char_const*>
                  ((string *)local_1b0,"Invalid post evaluation transform","");
        Result::Result(__return_storage_ptr__,INVALID_MODEL_PARAMETERS,(string *)local_1b0);
LAB_002f0743:
        if ((undefined1 *)local_1b0._0_8_ != local_1b0 + 0x10) {
          operator_delete((void *)local_1b0._0_8_,local_1b0._16_8_ + 1);
        }
      }
      Specification::GLMClassifier::~GLMClassifier((GLMClassifier *)local_130);
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_168._M_p != &local_158) {
        operator_delete(local_168._M_p,local_158._M_allocated_capacity + 1);
      }
      goto LAB_002f05dc;
    }
  }
  __return_storage_ptr__->m_type = local_170._0_4_;
  __return_storage_ptr__->m_reason = local_170._4_4_;
  paVar1 = &(__return_storage_ptr__->m_message).field_2;
  (__return_storage_ptr__->m_message)._M_dataplus._M_p = (pointer)paVar1;
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_168._M_p == &local_158) {
    paVar1->_M_allocated_capacity = local_158._M_allocated_capacity;
    *(undefined8 *)((long)&(__return_storage_ptr__->m_message).field_2 + 8) = local_158._8_8_;
  }
  else {
    (__return_storage_ptr__->m_message)._M_dataplus._M_p = local_168._M_p;
    (__return_storage_ptr__->m_message).field_2._M_allocated_capacity =
         local_158._M_allocated_capacity;
  }
  (__return_storage_ptr__->m_message)._M_string_length = local_160;
LAB_002f05dc:
  Specification::ModelDescription::~ModelDescription((ModelDescription *)local_e0);
  return __return_storage_ptr__;
}

Assistant:

Result validate<MLModelType_glmClassifier>(const Specification::Model& format) {

        // Check has a classifier interface
        Specification::ModelDescription interface = format.description();
        Result result = validateClassifierInterface(format, format.glmclassifier());
        if (!result.good()) {
            return result;
        }
        
        // Check that inputs are vectorizable
        result = validateDescriptionsAreAllVectorizableTypes(interface.input());
        if (!result.good()) {
            return result;
        }

        Specification::GLMClassifier glmClassifier = format.glmclassifier();

        // Check PostEvluationTransfrom and ClassEncoding have allowed values
        if(glmClassifier.postevaluationtransform() != Specification::GLMClassifier::Logit
           && glmClassifier.postevaluationtransform() != Specification::GLMClassifier::Probit) {
            return Result(ResultType::INVALID_MODEL_PARAMETERS, "Invalid post evaluation transform");
        }
        if(glmClassifier.classencoding() != Specification::GLMClassifier::ReferenceClass
           && glmClassifier.classencoding() != Specification::GLMClassifier::OneVsRest) {
            return Result(ResultType::INVALID_MODEL_PARAMETERS, "Invalid class encoding");
        }

        // Check has weights and same size as offsets
        int numCoefficient = glmClassifier.weights_size();
        if(numCoefficient == 0) {
            return Result(ResultType::INVALID_MODEL_PARAMETERS, "The number of DoubleArrays in weights must be greater than zero");
        }
        if(numCoefficient != glmClassifier.offset_size()) {
            return Result(ResultType::INVALID_MODEL_PARAMETERS, "The number of DoubleArrays in weights must match number of offsets");
        }

        // Check number of weight vector makes sense based on the number of classes and the class encoding
        int numClasses;
        switch (glmClassifier.ClassLabels_case()) {
            case Specification::GLMClassifier::kInt64ClassLabels:
                numClasses = glmClassifier.int64classlabels().vector_size();
                break;
            case Specification::GLMClassifier::kStringClassLabels:
                numClasses = glmClassifier.stringclasslabels().vector_size();
                break;
            case Specification::GLMClassifier::CLASSLABELS_NOT_SET:
                numClasses = -1;
                break;
        }
        if(glmClassifier.classencoding() == Specification::GLMClassifier::ReferenceClass) {
            if (numClasses != -1 && numCoefficient != numClasses - 1) {
                return Result(ResultType::INVALID_MODEL_PARAMETERS,
                          "With ReferenceClass encoding the number of DoubleArrays in weights must be one less than number of classes");
            }
        } else { // One vs Rest encoding
            if(numClasses == 2) {
                if(numCoefficient != 1) {
                    return Result(ResultType::INVALID_MODEL_PARAMETERS,
                                  "When using OneVsRest encoding for only two classes, the number of DoubleArrays in weights must be one");
                }
            } else if (numClasses != -1 && numCoefficient != numClasses) {
                return Result(ResultType::INVALID_MODEL_PARAMETERS,
                                  "With OneVsRest encoding the number of DoubleArrays in weights must equal the number of classes");
            }
        }

        // Probit is only supported for binary classification
        if(numClasses > 2 && glmClassifier.postevaluationtransform() == Specification::GLMClassifier::Probit) {
            return Result(ResultType::INVALID_MODEL_PARAMETERS, "Probit post evaluation transform is only supported for binary classification");
        }

        // Check all DoubleArrays in weights have the same, nonzero length
        auto weights = glmClassifier.weights();
        if(weights[0].value_size() == 0) {
            return Result(ResultType::INVALID_MODEL_PARAMETERS, "Weight DoubleArrays must have nonzero length");
        }
        for(int i = 1; i < weights.size(); i++) {
            if(weights[0].value_size() != weights[i].value_size()) {
                return Result(ResultType::INVALID_MODEL_PARAMETERS, "Weight DoubleArrays must have the same length");
            }
        }

        return Result();
    }